

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigPackage.cpp
# Opt level: O0

int __thiscall glcts::ConfigPackage::init(ConfigPackage *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  ApiType AVar2;
  int extraout_EAX;
  ConfigListCase *pCVar3;
  ConfigPackage *this_local;
  
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::es(2,0);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"es2","OpenGL ES 2 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::es(3,0);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"es3","OpenGL ES 3 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::es(3,1);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"es31","OpenGL ES 3.1 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::es(3,2);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"es32","OpenGL ES 3.2 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(3,0);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl30","OpenGL 3.0 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(3,1);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl31","OpenGL 3.1 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(3,2);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl32","OpenGL 3.2 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(3,3);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl33","OpenGL 3.3 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(4,0);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl40","OpenGL 4.0 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(4,1);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl41","OpenGL 4.1 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(4,2);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl42","OpenGL 4.2 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(4,3);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl43","OpenGL 4.3 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(4,4);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl44","OpenGL 4.4 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  pCVar3 = (ConfigListCase *)operator_new(0x78);
  pTVar1 = (this->super_TestPackage).super_TestNode.m_testCtx;
  AVar2 = glu::ApiType::core(4,5);
  ConfigListCase::ConfigListCase(pCVar3,pTVar1,"gl45","OpenGL 4.5 Configurations",AVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar3);
  return extraout_EAX;
}

Assistant:

void ConfigPackage::init(void)
{
	addChild(new ConfigListCase(m_testCtx, "es2", "OpenGL ES 2 Configurations", glu::ApiType::es(2, 0)));
	addChild(new ConfigListCase(m_testCtx, "es3", "OpenGL ES 3 Configurations", glu::ApiType::es(3, 0)));
	addChild(new ConfigListCase(m_testCtx, "es31", "OpenGL ES 3.1 Configurations", glu::ApiType::es(3, 1)));
	addChild(new ConfigListCase(m_testCtx, "es32", "OpenGL ES 3.2 Configurations", glu::ApiType::es(3, 2)));
	addChild(new ConfigListCase(m_testCtx, "gl30", "OpenGL 3.0 Configurations", glu::ApiType::core(3, 0)));
	addChild(new ConfigListCase(m_testCtx, "gl31", "OpenGL 3.1 Configurations", glu::ApiType::core(3, 1)));
	addChild(new ConfigListCase(m_testCtx, "gl32", "OpenGL 3.2 Configurations", glu::ApiType::core(3, 2)));
	addChild(new ConfigListCase(m_testCtx, "gl33", "OpenGL 3.3 Configurations", glu::ApiType::core(3, 3)));
	addChild(new ConfigListCase(m_testCtx, "gl40", "OpenGL 4.0 Configurations", glu::ApiType::core(4, 0)));
	addChild(new ConfigListCase(m_testCtx, "gl41", "OpenGL 4.1 Configurations", glu::ApiType::core(4, 1)));
	addChild(new ConfigListCase(m_testCtx, "gl42", "OpenGL 4.2 Configurations", glu::ApiType::core(4, 2)));
	addChild(new ConfigListCase(m_testCtx, "gl43", "OpenGL 4.3 Configurations", glu::ApiType::core(4, 3)));
	addChild(new ConfigListCase(m_testCtx, "gl44", "OpenGL 4.4 Configurations", glu::ApiType::core(4, 4)));
	addChild(new ConfigListCase(m_testCtx, "gl45", "OpenGL 4.5 Configurations", glu::ApiType::core(4, 5)));
}